

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::SetupTriangle(Codec *this)

{
  ushort uVar1;
  Codec *in_RDI;
  uint16_t pivot_i;
  uint16_t pivot_count;
  ushort local_c;
  
  uVar1 = in_RDI->_defer_count + in_RDI->_dense_count;
  for (local_c = 0; local_c < uVar1; local_c = local_c + 1) {
    in_RDI->_pivots[local_c] = local_c;
  }
  in_RDI->_next_pivot = 0;
  in_RDI->_pivot_count = (uint)uVar1;
  if (in_RDI->_first_heavy_column == 0) {
    InsertHeavyRows(in_RDI);
  }
  return;
}

Assistant:

void Codec::SetupTriangle()
{
    CAT_IF_DUMP(cout << endl << "---- SetupTriangle ----" << endl << endl;)

    CAT_DEBUG_ASSERT((unsigned)_defer_count + (unsigned)_dense_count < 65536);
    const uint16_t pivot_count = _defer_count + _dense_count;

    // Initialize pivot array to just non-heavy rows
    for (uint16_t pivot_i = 0; pivot_i < pivot_count; ++pivot_i) {
        _pivots[pivot_i] = pivot_i;
    }

    // Set resume point to the first column
    _next_pivot = 0;
    _pivot_count = pivot_count;

    // If heavy rows are used right from the start:
    if (_first_heavy_column <= 0) {
        InsertHeavyRows();
    }
}